

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O1

void ImPlot::CalculateBins<float>
               (float *values,int count,ImPlotBin meth,ImPlotRange *range,int *bins_out,
               double *width_out)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double __x;
  
  switch(meth) {
  case -4:
    __x = (double)count;
    dVar2 = 0.0;
    dVar3 = 0.0;
    if (0 < count) {
      uVar1 = 0;
      do {
        dVar3 = dVar3 + (double)values[uVar1] * (1.0 / __x);
        uVar1 = uVar1 + 1;
      } while ((uint)count != uVar1);
    }
    if (0 < count) {
      dVar2 = 0.0;
      uVar1 = 0;
      do {
        dVar2 = dVar2 + ((double)values[uVar1] - dVar3) * ((double)values[uVar1] - dVar3) *
                        (1.0 / (__x + -1.0));
        uVar1 = uVar1 + 1;
      } while ((uint)count != uVar1);
    }
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar3 = cbrt(__x);
    dVar3 = (dVar2 * 3.49) / dVar3;
    *width_out = dVar3;
    dVar2 = round((range->Max - range->Min) / dVar3);
    goto LAB_001c3155;
  case -3:
    dVar2 = cbrt((double)count);
    dVar2 = dVar2 + dVar2;
    break;
  case -2:
    dVar2 = log2((double)count);
    dVar2 = dVar2 + 1.0;
    break;
  case -1:
    dVar2 = (double)count;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    break;
  default:
    goto switchD_001c3041_default;
  }
  dVar2 = ceil(dVar2);
LAB_001c3155:
  *bins_out = (int)dVar2;
switchD_001c3041_default:
  *width_out = (range->Max - range->Min) / (double)*bins_out;
  return;
}

Assistant:

static inline void CalculateBins(const T* values, int count, ImPlotBin meth, const ImPlotRange& range, int& bins_out, double& width_out) {
    switch (meth) {
        case ImPlotBin_Sqrt:
            bins_out  = (int)ceil(sqrt(count));
            break;
        case ImPlotBin_Sturges:
            bins_out  = (int)ceil(1.0 + log2(count));
            break;
        case ImPlotBin_Rice:
            bins_out  = (int)ceil(2 * cbrt(count));
            break;
        case ImPlotBin_Scott:
            width_out = 3.49 * ImStdDev(values, count) / cbrt(count);
            bins_out  = (int)round(range.Size() / width_out);
            break;
    }
    width_out = range.Size() / bins_out;
}